

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall Token::Token(Token *this,NumericConstant *value)

{
  NumericConstant *value_local;
  Token *this_local;
  
  this->mType = NUMBER;
  NumericConstant::NumericConstant(&this->mNumericValue,value);
  this->mCharValue = '\0';
  this->mCharValue2 = '\0';
  std::__cxx11::string::string((string *)&this->mIdentifier);
  return;
}

Assistant:

Token::Token(NumericConstant value)
	: mType(TokenType::NUMBER),
	  mNumericValue(value),
	  mCharValue(0),
	  mCharValue2(0) {

}